

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowerMDSharedSimd128.cpp
# Opt level: O1

Instr * __thiscall LowererMD::Simd128AsmJsLowerStoreElem(LowererMD *this,Instr *instr)

{
  byte dataWidth;
  OpCode OVar1;
  ValueType valueType;
  int iVar2;
  Opnd *pOVar3;
  long lVar4;
  Opnd *this_00;
  Opnd *src1;
  IntConstOpnd *this_01;
  code *pcVar5;
  bool bVar6;
  OpndKind OVar7;
  byte bVar8;
  uint32 uVar9;
  undefined4 *puVar10;
  Instr *pIVar11;
  
  OVar1 = instr->m_opcode;
  if ((((0x11 < OVar1 - 0x306) || ((0x3c003U >> (OVar1 - 0x306 & 0x1f) & 1) == 0)) &&
      ((0x27 < OVar1 - 0x345 || ((0xc000000003U >> ((ulong)(OVar1 - 0x345) & 0x3f) & 1) == 0)))) &&
     ((0x24 < OVar1 - 0x38e || ((0x1800000003U >> ((ulong)(OVar1 - 0x38e) & 0x3f) & 1) == 0)))) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                       ,0xac8,
                       "(instr->m_opcode == Js::OpCode::Simd128_StArr_I4 || instr->m_opcode == Js::OpCode::Simd128_StArr_I8 || instr->m_opcode == Js::OpCode::Simd128_StArr_I16 || instr->m_opcode == Js::OpCode::Simd128_StArr_U4 || instr->m_opcode == Js::OpCode::Simd128_StArr_U8 || instr->m_opcode == Js::OpCode::Simd128_StArr_U16 || instr->m_opcode == Js::OpCode::Simd128_StArr_F4 || instr->m_opcode == Js::OpCode::Simd128_StArrConst_I4 || instr->m_opcode == Js::OpCode::Simd128_StArrConst_I8 || instr->m_opcode == Js::OpCode::Simd128_StArrConst_I16 || instr->m_opcode == Js::OpCode::Simd128_StArrConst_U4 || instr->m_opcode == Js::OpCode::Simd128_StArrConst_U8 || instr->m_opcode == Js::OpCode::Simd128_StArrConst_U16 || instr->m_opcode == Js::OpCode::Simd128_StArrConst_U4 || instr->m_opcode == Js::OpCode::Simd128_StArrConst_F4)"
                       ,
                       "instr->m_opcode == Js::OpCode::Simd128_StArr_I4 || instr->m_opcode == Js::OpCode::Simd128_StArr_I8 || instr->m_opcode == Js::OpCode::Simd128_StArr_I16 || instr->m_opcode == Js::OpCode::Simd128_StArr_U4 || instr->m_opcode == Js::OpCode::Simd128_StArr_U8 || instr->m_opcode == Js::OpCode::Simd128_StArr_U16 || instr->m_opcode == Js::OpCode::Simd128_StArr_F4 || instr->m_opcode == Js::OpCode::Simd128_StArrConst_I4 || instr->m_opcode == Js::OpCode::Simd128_StArrConst_I8 || instr->m_opcode == Js::OpCode::Simd128_StArrConst_I16 || instr->m_opcode == Js::OpCode::Simd128_StArrConst_U4 || instr->m_opcode == Js::OpCode::Simd128_StArrConst_U8 || instr->m_opcode == Js::OpCode::Simd128_StArrConst_U16 || instr->m_opcode == Js::OpCode::Simd128_StArrConst_U4 || instr->m_opcode == Js::OpCode::Simd128_StArrConst_F4"
                      );
    if (!bVar6) goto LAB_00678358;
    *puVar10 = 0;
  }
  pIVar11 = instr->m_prev;
  pOVar3 = instr->m_dst;
  OVar7 = IR::Opnd::GetKind(pOVar3);
  if (OVar7 != OpndKindIndir) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x1c8,"(this->IsIndirOpnd())","Bad call to AsIndirOpnd()");
    if (!bVar6) goto LAB_00678358;
    *puVar10 = 0;
  }
  lVar4._0_2_ = pOVar3[1].m_valueType;
  lVar4._2_1_ = pOVar3[1].m_type;
  lVar4._3_1_ = pOVar3[1].field_0xb;
  lVar4._4_1_ = pOVar3[1].m_kind;
  lVar4._5_1_ = pOVar3[1].isDeleted;
  lVar4._6_2_ = *(undefined2 *)&pOVar3[1].field_0xe;
  pOVar3 = instr->m_dst;
  OVar7 = IR::Opnd::GetKind(pOVar3);
  if (OVar7 != OpndKindIndir) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x1c8,"(this->IsIndirOpnd())","Bad call to AsIndirOpnd()");
    if (!bVar6) goto LAB_00678358;
    *puVar10 = 0;
  }
  this_00 = instr->m_dst;
  src1 = instr->m_src1;
  this_01 = (IntConstOpnd *)instr->m_src2;
  valueType.field_0 =
       (anon_union_2_4_ea848c7b_for_ValueType_13)
       *(anon_union_2_4_ea848c7b_for_ValueType_13 *)
        &((anon_union_2_4_ea848c7b_for_ValueType_13 *)(pOVar3[1]._vptr_Opnd + 1))->field_0;
  dataWidth = instr->dataWidth;
  bVar6 = IRType_IsSimd128(this_00->m_type);
  if (bVar6) {
    bVar6 = IRType_IsSimd128(src1->m_type);
    if ((!bVar6) || ((this_01->super_Opnd).m_type != TyUint32)) goto LAB_006780cc;
  }
  else {
LAB_006780cc:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                       ,0xad4,
                       "(dst->IsSimd128() && src1->IsSimd128() && src2->GetType() == TyUint32)",
                       "dst->IsSimd128() && src1->IsSimd128() && src2->GetType() == TyUint32");
    if (!bVar6) goto LAB_00678358;
    *puVar10 = 0;
  }
  if (lVar4 == 0) {
    OVar7 = IR::Opnd::GetKind(this_00);
    if (OVar7 != OpndKindIndir) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar10 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x1c8,"(this->IsIndirOpnd())","Bad call to AsIndirOpnd()");
      if (!bVar6) goto LAB_00678358;
      *puVar10 = 0;
    }
    if (*(int *)&this_00[2]._vptr_Opnd + (uint)dataWidth < 0x1000001) {
      OVar7 = IR::Opnd::GetKind((Opnd *)this_01);
      if (OVar7 == OpndKindIntConst) {
        OVar7 = IR::Opnd::GetKind(this_00);
        if (OVar7 != OpndKindIndir) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar10 = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                             ,0x1c8,"(this->IsIndirOpnd())","Bad call to AsIndirOpnd()");
          if (!bVar6) goto LAB_00678358;
          *puVar10 = 0;
        }
        iVar2 = *(int *)&this_00[2]._vptr_Opnd;
        OVar7 = IR::Opnd::GetKind((Opnd *)this_01);
        if (OVar7 != OpndKindIntConst) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar10 = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                             ,0xc0,"(this->IsIntConstOpnd())","Bad call to AsIntConstOpnd()");
          if (!bVar6) {
LAB_00678358:
            pcVar5 = (code *)invalidInstructionException();
            (*pcVar5)();
          }
          *puVar10 = 0;
        }
        uVar9 = IR::IntConstOpnd::AsUint32(this_01);
        if (uVar9 < iVar2 + (uint)dataWidth) {
          Lowerer::GenerateRuntimeError
                    (this->m_lowerer,instr,-0x7ff5ebf6,HelperOp_RuntimeRangeError);
          IR::Instr::Remove(instr);
          return pIVar11;
        }
      }
      goto LAB_006781fe;
    }
  }
  bVar8 = Lowerer::GetArrayIndirScale(valueType);
  LowererMDArch::LowerAsmJsStElemHelper
            (&this->lowererMDArch,instr,true,dataWidth != (byte)(1 << (bVar8 & 0x1f)));
LAB_006781fe:
  pIVar11 = Simd128ConvertToStore(this,this_00,src1,dataWidth,instr,'\0');
  return pIVar11;
}

Assistant:

IR::Instr*
LowererMD::Simd128AsmJsLowerStoreElem(IR::Instr *instr)
{
    Assert(
        instr->m_opcode == Js::OpCode::Simd128_StArr_I4 ||
        instr->m_opcode == Js::OpCode::Simd128_StArr_I8 ||
        instr->m_opcode == Js::OpCode::Simd128_StArr_I16 ||
        instr->m_opcode == Js::OpCode::Simd128_StArr_U4 ||
        instr->m_opcode == Js::OpCode::Simd128_StArr_U8 ||
        instr->m_opcode == Js::OpCode::Simd128_StArr_U16 ||
        instr->m_opcode == Js::OpCode::Simd128_StArr_F4 ||
        //instr->m_opcode == Js::OpCode::Simd128_StArr_D2 ||
        instr->m_opcode == Js::OpCode::Simd128_StArrConst_I4 ||
        instr->m_opcode == Js::OpCode::Simd128_StArrConst_I8 ||
        instr->m_opcode == Js::OpCode::Simd128_StArrConst_I16 ||
        instr->m_opcode == Js::OpCode::Simd128_StArrConst_U4 ||
        instr->m_opcode == Js::OpCode::Simd128_StArrConst_U8 ||
        instr->m_opcode == Js::OpCode::Simd128_StArrConst_U16 ||
        instr->m_opcode == Js::OpCode::Simd128_StArrConst_U4 ||
        instr->m_opcode == Js::OpCode::Simd128_StArrConst_F4
        //instr->m_opcode == Js::OpCode::Simd128_StArrConst_D2
        );

    IR::Instr * instrPrev = instr->m_prev;
    IR::RegOpnd * indexOpnd = instr->GetDst()->AsIndirOpnd()->GetIndexOpnd();
    IR::RegOpnd * baseOpnd = instr->GetDst()->AsIndirOpnd()->GetBaseOpnd();
    IR::Opnd * dst = instr->GetDst();
    IR::Opnd * src1 = instr->GetSrc1();
    IR::Opnd * src2 = instr->GetSrc2();
    ValueType arrType = baseOpnd->GetValueType();
    uint8 dataWidth = instr->dataWidth;

    // Type-specialized.
    Assert(dst->IsSimd128() && src1->IsSimd128() && src2->GetType() == TyUint32);

    IR::Instr * done;

    if (indexOpnd || ((uint32)dst->AsIndirOpnd()->GetOffset() + dataWidth > 0x1000000))
    {
        // CMP indexOpnd, src2(arrSize)
        // JA $helper
        // JMP $store
        // $helper:
        // Throw RangeError
        // JMP $done
        // $store:
        // MOV dst([arrayBuffer + indexOpnd]), src1
        // $done:
        uint32 bpe = Simd128GetTypedArrBytesPerElem(arrType);
        done = this->lowererMDArch.LowerAsmJsStElemHelper(instr, true, bpe != dataWidth);
    }
    else
    {
        // we might have a constant index if globopt propped a constant store. we can ahead of time check if it is in-bounds
        if (src2->IsIntConstOpnd() && ((uint32)dst->AsIndirOpnd()->GetOffset() + dataWidth > src2->AsIntConstOpnd()->AsUint32()))
        {
            m_lowerer->GenerateRuntimeError(instr, JSERR_ArgumentOutOfRange, IR::HelperOp_RuntimeRangeError);
            instr->Remove();
            return instrPrev;
        }
        done = instr;
    }

    return Simd128ConvertToStore(dst, src1, dataWidth, instr);
}